

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O1

FunctionPrototypeSyntax * __thiscall
slang::parsing::Parser::parseFunctionPrototype
          (Parser *this,SyntaxKind parentKind,
          bitmask<slang::parsing::detail::FunctionOptions> options,bool *isConstructor)

{
  SyntaxNode *pSVar1;
  bool bVar2;
  TokenKind TVar3;
  SyntaxKind SVar4;
  ImplicitTypeSyntax *returnType;
  ImplicitTypeSyntax *this_00;
  SourceLocation SVar5;
  Diagnostic *pDVar6;
  FunctionPortListSyntax *portList;
  FunctionPrototypeSyntax *pFVar7;
  ImplicitTypeSyntax *pIVar8;
  ScopedNameSyntax *scoped;
  bitmask<slang::parsing::detail::FunctionOptions> options_00;
  span<slang::syntax::ClassSpecifierSyntax_*,_18446744073709551615UL> sVar9;
  SourceRange SVar10;
  Token TVar11;
  pointer local_b0;
  Token local_a8;
  SyntaxKind local_98;
  uint32_t index;
  Token lifetime;
  __extent_storage<18446744073709551615UL> local_80;
  SyntaxList<slang::syntax::ClassSpecifierSyntax> local_78;
  Token local_40;
  
  local_98 = parentKind;
  Token::Token(&local_a8);
  bVar2 = ParserBase::peek(&this->super_ParserBase,TaskKeyword);
  if (bVar2) {
    local_a8 = ParserBase::consume(&this->super_ParserBase);
  }
  else {
    local_a8 = ParserBase::expect(&this->super_ParserBase,FunctionKeyword);
  }
  sVar9 = parseClassSpecifierList(this,SUB41((options.m_bits & 8) >> 3,0));
  lifetime = parseLifetime(this);
  if (((byte)((options.m_bits & 2) >> 1) & lifetime.info != (Info *)0x0) == 1) {
    SVar10 = Token::range(&lifetime);
    ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0xc60005,SVar10);
  }
  index = 0;
  bVar2 = scanQualifiedName(this,&index,true);
  if ((bVar2) &&
     (TVar11 = ParserBase::peek(&this->super_ParserBase,index), (TVar11._0_4_ & 0xfffd) == 0x11)) {
    Token::Token(&local_40);
    local_78.super_SyntaxListBase.super_SyntaxNode.kind = 1;
    local_78.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
    local_78.super_SyntaxListBase.super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
    local_78.super_SyntaxListBase.childCount = 0;
    local_78.super_span<slang::syntax::ClassSpecifierSyntax_*,_18446744073709551615UL>._M_ptr =
         (pointer)0x0;
    local_78.super_span<slang::syntax::ClassSpecifierSyntax_*,_18446744073709551615UL>._M_extent.
    _M_extent_value = 0;
    local_78.super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_002f88b8;
    TVar11 = ParserBase::placeholderToken(&this->super_ParserBase);
    returnType = syntax::SyntaxFactory::implicitType
                           (&this->factory,local_40,
                            (SyntaxList<slang::syntax::VariableDimensionSyntax> *)&local_78,TVar11);
  }
  else {
    returnType = (ImplicitTypeSyntax *)
                 parseDataType(this,(bitmask<slang::parsing::detail::TypeOptions>)0x3);
  }
  this_00 = (ImplicitTypeSyntax *)parseName(this);
  SVar4 = (this_00->super_DataTypeSyntax).super_ExpressionSyntax.super_SyntaxNode.kind;
  if (SVar4 == ScopedName) {
    if ((**(int **)&this_00->signing == 0xe5) || (**(int **)&this_00->signing == 0x67)) {
      SVar4 = **(SyntaxKind **)&(this_00->dimensions).super_SyntaxListBase.super_SyntaxNode;
      goto LAB_001e168e;
    }
LAB_001e169a:
    SVar5 = Token::location(&local_a8);
    pDVar6 = ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x540005,SVar5);
    SVar10 = syntax::SyntaxNode::sourceRange((SyntaxNode *)this_00);
    Diagnostic::operator<<(pDVar6,SVar10);
  }
  else {
LAB_001e168e:
    if ((SVar4 != ConstructorName) && (SVar4 != IdentifierName)) goto LAB_001e169a;
  }
  if (((options.m_bits & 2) == 0) ||
     ((this_00->super_DataTypeSyntax).super_ExpressionSyntax.super_SyntaxNode.kind != ScopedName)) {
    if ((lifetime.kind == StaticKeyword) &&
       (((this_00->super_DataTypeSyntax).super_ExpressionSyntax.super_SyntaxNode.kind == ScopedName
        && (*(short *)&(this_00->signing).info == 0x17)))) {
      SVar10 = Token::range(&lifetime);
      ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x7c0005,SVar10);
    }
  }
  else {
    local_78.super_SyntaxListBase._0_16_ = syntax::SyntaxNode::getFirstToken((SyntaxNode *)this_00);
    SVar5 = Token::location((Token *)&local_78);
    ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0xa50005,SVar5);
  }
  local_80 = sVar9._M_extent._M_extent_value;
  local_b0 = (pointer)sVar9._M_ptr;
  TVar11 = ParserBase::getLastConsumed(&this->super_ParserBase);
  TVar3 = TVar11.kind;
  if (isConstructor != (bool *)0x0) {
    *isConstructor = TVar3 == NewKeyword;
  }
  options_00.m_bits = options.m_bits | 4;
  if (TVar3 != NewKeyword) {
    options_00.m_bits = options.m_bits;
  }
  pIVar8 = this_00;
  if (local_a8.kind == TaskKeyword) {
    if ((returnType->super_DataTypeSyntax).super_ExpressionSyntax.super_SyntaxNode.kind ==
        ImplicitType) {
      if (TVar3 != NewKeyword) goto LAB_001e18dd;
      SVar5 = Token::location(&local_a8);
      pDVar6 = ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0xa70005,SVar5);
    }
    else {
      SVar5 = Token::location(&local_a8);
      pDVar6 = ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0xa80005,SVar5);
      pIVar8 = returnType;
    }
LAB_001e1844:
    SVar10 = syntax::SyntaxNode::sourceRange((SyntaxNode *)pIVar8);
    Diagnostic::operator<<(pDVar6,SVar10);
  }
  else {
    if (TVar3 != NewKeyword) {
      if (((options_00.m_bits & 1) == 0) &&
         ((returnType->super_DataTypeSyntax).super_ExpressionSyntax.super_SyntaxNode.kind ==
          ImplicitType)) {
        local_78.super_SyntaxListBase._0_16_ =
             syntax::SyntaxNode::getFirstToken((SyntaxNode *)this_00);
        SVar5 = Token::location((Token *)&local_78);
        ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x610005,SVar5);
      }
      goto LAB_001e18dd;
    }
    if ((returnType->super_DataTypeSyntax).super_ExpressionSyntax.super_SyntaxNode.kind ==
        ImplicitType) {
      if ((local_98 == ClassDeclaration) ||
         ((this_00->super_DataTypeSyntax).super_ExpressionSyntax.super_SyntaxNode.kind == ScopedName
         )) {
        if ((local_80._M_extent_value != 0 & (byte)options.m_bits >> 3) != 1) goto LAB_001e18dd;
        SVar10 = syntax::SyntaxNode::sourceRange((SyntaxNode *)*local_b0);
        pDVar6 = ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0xa30005,SVar10);
        goto LAB_001e1844;
      }
      SVar5 = Token::location(&local_a8);
      pDVar6 = ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x100005,SVar5);
    }
    else {
      local_78.super_SyntaxListBase._0_16_ =
           syntax::SyntaxNode::getFirstToken((SyntaxNode *)this_00);
      SVar5 = Token::location((Token *)&local_78);
      pDVar6 = ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x110005,SVar5);
      pIVar8 = returnType;
    }
    SVar10 = syntax::SyntaxNode::sourceRange((SyntaxNode *)pIVar8);
    Diagnostic::operator<<(pDVar6,SVar10);
  }
LAB_001e18dd:
  pSVar1 = this->previewNode;
  this->previewNode = (SyntaxNode *)0x0;
  portList = parseFunctionPortList(this,options_00);
  this->previewNode = pSVar1;
  local_78.super_SyntaxListBase.super_SyntaxNode.kind = 1;
  local_78.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
  local_78.super_SyntaxListBase.super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  local_78.super_SyntaxListBase.childCount = local_80._M_extent_value;
  local_78.super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_002f8f38;
  local_78.super_span<slang::syntax::ClassSpecifierSyntax_*,_18446744073709551615UL> = sVar9;
  pFVar7 = syntax::SyntaxFactory::functionPrototype
                     (&this->factory,local_a8,&local_78,lifetime,&returnType->super_DataTypeSyntax,
                      (NameSyntax *)this_00,portList);
  return pFVar7;
}

Assistant:

FunctionPrototypeSyntax& Parser::parseFunctionPrototype(SyntaxKind parentKind,
                                                        bitmask<FunctionOptions> options,
                                                        bool* isConstructor) {
    Token keyword;
    if (peek(TokenKind::TaskKeyword))
        keyword = consume();
    else
        keyword = expect(TokenKind::FunctionKeyword);

    const bool allowSpecifiers = options.has(FunctionOptions::AllowOverrideSpecifiers);
    auto specifiers = parseClassSpecifierList(allowSpecifiers);

    auto lifetime = parseLifetime();
    if (lifetime && options.has(FunctionOptions::IsPrototype))
        addDiag(diag::LifetimeForPrototype, lifetime.range());

    // Return type is optional for function declarations, and should not be given
    // for tasks and constructors (we'll check that below).
    DataTypeSyntax* returnType = nullptr;
    uint32_t index = 0;
    if (!scanQualifiedName(index, /* allowNew */ true))
        returnType = &parseDataType(TypeOptions::AllowImplicit | TypeOptions::AllowVoid);
    else {
        auto next = peek(index);
        if (next.kind != TokenKind::Semicolon && next.kind != TokenKind::OpenParenthesis)
            returnType = &parseDataType(TypeOptions::AllowImplicit | TypeOptions::AllowVoid);
        else
            returnType = &factory.implicitType(Token(), nullptr, placeholderToken());
    }

    auto& name = parseName();
    if (!checkSubroutineName(name))
        addDiag(diag::ExpectedSubroutineName, keyword.location()) << name.sourceRange();

    if (options.has(FunctionOptions::IsPrototype) && name.kind == SyntaxKind::ScopedName) {
        addDiag(diag::SubroutinePrototypeScoped, name.getFirstToken().location());
    }
    else if (lifetime.kind == TokenKind::StaticKeyword && name.kind == SyntaxKind::ScopedName &&
             name.as<ScopedNameSyntax>().separator.kind == TokenKind::DoubleColon) {
        addDiag(diag::MethodStaticLifetime, lifetime.range());
    }

    bool constructor = getLastConsumed().kind == TokenKind::NewKeyword;
    if (isConstructor)
        *isConstructor = constructor;

    if (constructor)
        options |= FunctionOptions::AllowDefaultArg;

    if (keyword.kind == TokenKind::TaskKeyword) {
        if (returnType->kind != SyntaxKind::ImplicitType)
            addDiag(diag::TaskReturnType, keyword.location()) << returnType->sourceRange();
        else if (constructor)
            addDiag(diag::TaskConstructor, keyword.location()) << name.sourceRange();
    }
    else if (constructor) {
        if (returnType->kind != SyntaxKind::ImplicitType) {
            addDiag(diag::ConstructorReturnType, name.getFirstToken().location())
                << returnType->sourceRange();
        }
        else if (name.kind != SyntaxKind::ScopedName &&
                 parentKind != SyntaxKind::ClassDeclaration) {
            addDiag(diag::ConstructorOutsideClass, keyword.location()) << name.sourceRange();
        }
        else if (allowSpecifiers && !specifiers.empty()) {
            addDiag(diag::SpecifiersNotAllowed, specifiers[0]->sourceRange()) << name.sourceRange();
        }
    }
    else if (!options.has(FunctionOptions::AllowImplicitReturn) &&
             returnType->kind == SyntaxKind::ImplicitType) {
        addDiag(diag::ImplicitNotAllowed, name.getFirstToken().location());
    }

    // If the function returns a declared enum type, save it off here
    // so that we don't suck it into the port list.
    auto savedPN = std::exchange(previewNode, nullptr);
    auto portList = parseFunctionPortList(options);
    previewNode = savedPN;

    return factory.functionPrototype(keyword, specifiers, lifetime, *returnType, name, portList);
}